

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

sexp sexp_double_to_bignum(sexp ctx,double f)

{
  sexp a;
  double dVar1;
  ulong in_XMM0_Qb;
  ulong extraout_XMM0_Qb;
  sexp res;
  sexp scale;
  sexp tmp;
  sexp local_80;
  sexp local_78;
  sexp local_70;
  double local_68;
  ulong uStack_60;
  double local_58;
  ulong uStack_50;
  sexp_gc_var_t local_48;
  sexp_gc_var_t local_38;
  sexp_gc_var_t local_28;
  
  local_48.var = &local_80;
  local_80 = (sexp)0x43e;
  local_28.var = &local_78;
  local_78 = (sexp)0x43e;
  local_38.var = &local_70;
  local_70 = (sexp)&DAT_0000043e;
  local_28.next = &local_48;
  local_48.next = (ctx->value).context.saves;
  local_38.next = &local_28;
  (ctx->value).context.saves = &local_38;
  local_68 = f;
  uStack_60 = in_XMM0_Qb;
  local_80 = sexp_fixnum_to_bignum(ctx,(sexp)&DAT_00000001);
  a = sexp_fixnum_to_bignum(ctx,(sexp)&DAT_00000003);
  uStack_50 = uStack_60 & 0x7fffffffffffffff;
  local_58 = ABS(local_68);
  local_78 = a;
  while (1.0 <= local_58) {
    dVar1 = fmod(local_58,16.0);
    local_70 = sexp_bignum_fxmul(ctx,(sexp)0x0,a,
                                 (long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f |
                                 (long)dVar1,0);
    local_80 = sexp_bignum_add(ctx,local_80,local_80,local_70);
    a = sexp_bignum_fxmul(ctx,(sexp)0x0,local_78,0x10,0);
    local_78 = a;
    local_58 = trunc(local_58 * 0.0625);
    uStack_50 = extraout_XMM0_Qb;
  }
  (local_80->value).flonum_bits[0] = -(local_68 < 0.0) | 1;
  (ctx->value).context.saves = local_48.next;
  return local_80;
}

Assistant:

sexp sexp_double_to_bignum (sexp ctx, double f) {
  int sign;
  sexp_gc_var3(res, scale, tmp);
  sexp_gc_preserve3(ctx, res, scale, tmp);
  res = sexp_fixnum_to_bignum(ctx, SEXP_ZERO);
  scale = sexp_fixnum_to_bignum(ctx, SEXP_ONE);
  sign = (f < 0 ? -1 : 1);
  for (f=fabs(f); f >= 1.0; f=trunc(f/16)) {
    tmp = sexp_bignum_fxmul(ctx, NULL, scale, (sexp_uint_t)double_16s_digit(f), 0);
    res = sexp_bignum_add(ctx, res, res, tmp);
    scale = sexp_bignum_fxmul(ctx, NULL, scale, 16, 0);
  }
  sexp_bignum_sign(res) = sign;
  sexp_gc_release3(ctx);
  return res;
}